

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

Vec_Int_t * Cba_NtkCollectOutFons(Cba_Ntk_t *p,Vec_Int_t *vObjs)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  void *__s;
  void *__s_00;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(400);
  p_00->pArray = piVar5;
  uVar2 = (p->vObjType).nSize;
  iVar8 = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
  if (iVar8 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar8 * 4);
  }
  memset(__s,0,(long)iVar8 << 2);
  uVar2 = (p->vFonObj).nSize;
  iVar12 = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
  if (iVar12 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    __s_00 = malloc((long)iVar12 * 4);
  }
  memset(__s_00,0,(long)iVar12 << 2);
  iVar3 = vObjs->nSize;
  if (0 < (long)iVar3) {
    piVar5 = vObjs->pArray;
    lVar10 = 0;
    do {
      uVar2 = piVar5[lVar10];
      if (((int)uVar2 < 0) || (iVar8 * 0x20 <= (int)uVar2)) {
LAB_003d807f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      puVar1 = (uint *)((long)__s + (ulong)(uVar2 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
      lVar10 = lVar10 + 1;
    } while (iVar3 != lVar10);
  }
  uVar6 = (ulong)(p->vObjType).nSize;
  if (1 < (long)uVar6) {
    uVar2 = (p->vObjType).nSize;
    if ((int)uVar2 < 2) {
      uVar2 = 1;
    }
    uVar11 = 1;
    do {
      if (uVar11 == uVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p->vObjType).pArray[uVar11] != '\0') {
        if ((long)(iVar8 * 0x20) <= (long)uVar11) {
LAB_003d8041:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if ((*(uint *)((long)__s + (uVar11 >> 5 & 0x7ffffff) * 4) >> ((uint)uVar11 & 0x1f) & 1) == 0
           ) {
          if ((long)(p->vObjFin0).nSize <= (long)uVar11) goto LAB_003d7f4b;
          lVar10 = (long)(p->vObjFin0).nSize;
          if (lVar10 <= (long)(uVar11 + 1)) goto LAB_003d7f4b;
          piVar5 = (p->vObjFin0).pArray;
          uVar4 = piVar5[uVar11];
          uVar7 = (ulong)uVar4;
          while ((int)uVar7 < piVar5[uVar11 + 1]) {
            if ((int)uVar4 < 1) {
              __assert_fail("f>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
            }
            if ((p->vFinFon).nSize <= (int)uVar7) goto LAB_003d7f4b;
            uVar9 = (p->vFinFon).pArray[uVar7];
            if (0 < (int)uVar9) {
              if (iVar12 * 0x20 <= (int)uVar9) goto LAB_003d807f;
              puVar1 = (uint *)((long)__s_00 + (ulong)(uVar9 >> 5) * 4);
              *puVar1 = *puVar1 | 1 << ((byte)uVar9 & 0x1f);
            }
            uVar7 = uVar7 + 1;
            if (lVar10 <= (long)(uVar11 + 1)) goto LAB_003d7f4b;
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar6);
  }
  if (0 < vObjs->nSize) {
    lVar10 = 0;
    do {
      uVar2 = vObjs->pArray[lVar10];
      if ((int)uVar2 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if (((p->vObjFon0).nSize <= (int)uVar2) || ((p->vObjFon0).nSize <= (int)(uVar2 + 1))) {
LAB_003d7f4b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar4 = (p->vObjFon0).pArray[uVar2];
      uVar9 = uVar4;
      while ((int)uVar9 < (p->vObjFon0).pArray[(ulong)uVar2 + 1]) {
        if (((int)uVar4 < 0) || (iVar12 * 0x20 <= (int)uVar9)) goto LAB_003d8041;
        if ((*(uint *)((long)__s_00 + (ulong)(uVar9 >> 5) * 4) >> (uVar9 & 0x1f) & 1) != 0) {
          Vec_IntPush(p_00,uVar9);
        }
        uVar9 = uVar9 + 1;
        if ((p->vObjFon0).nSize <= (int)(uVar2 + 1)) goto LAB_003d7f4b;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < vObjs->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Cba_NtkCollectOutFons( Cba_Ntk_t * p, Vec_Int_t * vObjs )
{
    Vec_Int_t * vFons = Vec_IntAlloc( 100 );
    Vec_Bit_t * vMapObjs = Vec_BitStart( Cba_NtkObjNum(p) + 1 );
    Vec_Bit_t * vVisFons = Vec_BitStart( Cba_NtkFonNum(p) + 1 );
    int i, k, iObj, iFin, iFon;
    // map objects
    Vec_IntForEachEntry( vObjs, iObj, i )
        Vec_BitWriteEntry( vMapObjs, iObj, 1 );
    // mark those used by non-objects
    Cba_NtkForEachObj( p, iObj )
        if ( !Vec_BitEntry(vMapObjs, iObj) )
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                if ( iFon > 0 )
                    Vec_BitWriteEntry( vVisFons, iFon, 1 );
    // collect pointed fons among those in objects
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjForEachFon( p, iObj, iFon, k )
            if ( Vec_BitEntry(vVisFons, iFon) )
                Vec_IntPush( vFons, iFon );
    Vec_BitFree( vMapObjs );
    Vec_BitFree( vVisFons );
    return vFons;
}